

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

ImRect __thiscall ImGuiWindow::TitleBarRect(ImGuiWindow *this)

{
  undefined1 auVar1 [16];
  float fVar2;
  ImGuiContext *g;
  undefined1 auVar3 [16];
  ImRect IVar4;
  
  auVar1._0_4_ = (this->SizeFull).x;
  auVar1._4_4_ = (this->SizeFull).y;
  auVar1._8_4_ = (this->ContentSize).x;
  auVar1._12_4_ = (this->ContentSize).y;
  auVar3 = ZEXT816(0) << 0x40;
  if ((this->Flags & 1) == 0) {
    fVar2 = GImGui->FontBaseSize * this->FontWindowScale;
    if (this->ParentWindow != (ImGuiWindow *)0x0) {
      fVar2 = fVar2 * this->ParentWindow->FontWindowScale;
    }
    auVar3 = vfmadd132ss_fma(ZEXT416((uint)(GImGui->Style).FramePadding.y),ZEXT416((uint)fVar2),
                             ZEXT416(0x40000000));
  }
  auVar1 = vinsertps_avx(auVar1,auVar3,0x10);
  IVar4.Max.x = (this->Pos).x + auVar1._0_4_;
  IVar4.Max.y = (this->Pos).y + auVar1._4_4_;
  IVar4.Min = this->Pos;
  return IVar4;
}

Assistant:

ImRect      TitleBarRect() const        { return ImRect(Pos, ImVec2(Pos.x + SizeFull.x, Pos.y + TitleBarHeight())); }